

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall
cmFindPackageCommand::LoadPackageRegistryDir
          (cmFindPackageCommand *this,string *dir,cmSearchPath *outPaths)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  Status SVar4;
  unsigned_long uVar5;
  pointer __s;
  cmFindPackageCommand *this_00;
  ulong dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory files;
  string fentry;
  string fname;
  cmFindPackageCommandHoldFile holdFile;
  ifstream fin;
  Directory local_2c0;
  undefined1 local_2b8 [48];
  string local_288;
  cmSearchPath *local_268;
  string *local_260;
  string local_258;
  pointer local_238;
  pointer local_230;
  pointer local_228;
  pointer pbStack_220;
  pointer local_218;
  pointer local_210;
  
  local_268 = outPaths;
  cmsys::Directory::Directory(&local_2c0);
  local_260 = dir;
  SVar4 = cmsys::Directory::Load(&local_2c0,dir,(string *)0x0);
  if (SVar4.Kind_ == Success) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    dindex = 0;
    while( true ) {
      uVar5 = cmsys::Directory::GetNumberOfFiles(&local_2c0);
      if (uVar5 <= dindex) break;
      pbVar1 = (pointer)(local_260->_M_dataplus)._M_p;
      pbVar2 = (pointer)local_260->_M_string_length;
      local_2b8._0_8_ = &DAT_00000001;
      local_2b8[0x10] = '/';
      local_2b8._8_8_ = (pointer)(local_2b8 + 0x10);
      __s = (pointer)cmsys::Directory::GetFile(&local_2c0,dindex);
      local_228 = (pointer)local_2b8._0_8_;
      pbStack_220 = (pointer)local_2b8._8_8_;
      local_238 = pbVar2;
      local_230 = pbVar1;
      local_218 = (pointer)strlen((char *)__s);
      views._M_len = 3;
      views._M_array = (iterator)&stack0xfffffffffffffdc8;
      local_210 = __s;
      cmCatViews_abi_cxx11_(&local_258,views);
      std::__cxx11::string::operator=((string *)&local_288,(string *)&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      bVar3 = cmsys::SystemTools::FileIsDirectory(&local_288);
      pbVar1 = (pointer)(local_2b8 + 0x10);
      if (!bVar3) {
        local_258._M_dataplus._M_p = local_288._M_dataplus._M_p;
        std::ifstream::ifstream(&stack0xfffffffffffffdc8,local_288._M_dataplus._M_p,_S_in|_S_bin);
        local_2b8._8_8_ = (pointer)0x0;
        local_2b8[0x10] = '\0';
        local_2b8._0_8_ = pbVar1;
        if ((*(byte *)((long)&stack0xfffffffffffffde8 + local_238[-1]._M_string_length) & 5) == 0) {
          this_00 = (cmFindPackageCommand *)&stack0xfffffffffffffdc8;
          bVar3 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)this_00,(string *)local_2b8,(bool *)0x0,0xffffffffffffffff);
          if (bVar3) {
            bVar3 = CheckPackageRegistryEntry(this_00,(string *)local_2b8,local_268);
            if (bVar3) {
              local_258._M_dataplus._M_p = (pointer)0x0;
            }
          }
        }
        if ((pointer)local_2b8._0_8_ != pbVar1) {
          operator_delete((void *)local_2b8._0_8_,CONCAT71(local_2b8._17_7_,local_2b8[0x10]) + 1);
        }
        std::ifstream::~ifstream(&stack0xfffffffffffffdc8);
        anon_unknown.dwarf_11f31fd::cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile
                  ((cmFindPackageCommandHoldFile *)&local_258);
      }
      dindex = dindex + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
  }
  cmsys::Directory::~Directory(&local_2c0);
  return;
}

Assistant:

void cmFindPackageCommand::LoadPackageRegistryDir(std::string const& dir,
                                                  cmSearchPath& outPaths)
{
  cmsys::Directory files;
  if (!files.Load(dir)) {
    return;
  }

  std::string fname;
  for (unsigned long i = 0; i < files.GetNumberOfFiles(); ++i) {
    fname = cmStrCat(dir, '/', files.GetFile(i));

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // Hold this file hostage until it behaves.
      cmFindPackageCommandHoldFile holdFile(fname.c_str());

      // Load the file.
      cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
      std::string fentry;
      if (fin && cmSystemTools::GetLineFromStream(fin, fentry) &&
          this->CheckPackageRegistryEntry(fentry, outPaths)) {
        // The file references an existing package, so release it.
        holdFile.Release();
      }
    }
  }

  // TODO: Wipe out the directory if it is empty.
}